

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::predict_or_learn_bag<true>(cb_explore *data,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  float fVar10;
  action_scores probs;
  action_score local_68;
  polyprediction *local_60;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  if ((data->cbcs).num_actions != 0) {
    uVar6 = 0;
    do {
      local_68.score = 0.0;
      local_68.action = uVar6;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_68);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (data->cbcs).num_actions);
  }
  local_60 = &ec->pred;
  uVar2 = data->bag_size;
  if (uVar2 != 0) {
    uVar9 = 0;
    do {
      fVar10 = merand48(&data->all->random_state);
      if (fVar10 <= 0.36787945) {
        lVar5 = 0x30;
        bVar3 = false;
        uVar6 = 0;
      }
      else {
        lVar5 = 0x28;
        if (fVar10 <= 0.7357589) {
          uVar6 = 1;
          bVar3 = false;
        }
        else {
          uVar6 = 2;
          bVar3 = true;
          if (((((((0.9196986 < fVar10) && (uVar6 = 3, 0.98101187 < fVar10)) &&
                 (uVar6 = 4, 0.99634016 < fVar10)) &&
                ((uVar6 = 5, 0.9994058 < fVar10 && (uVar6 = 6, 0.99991673 < fVar10)))) &&
               ((uVar6 = 7, 0.99998975 < fVar10 &&
                ((uVar6 = 8, 0.99999887 < fVar10 && (uVar6 = 9, 0.9999999 < fVar10)))))) &&
              (uVar6 = 10, 1.0 < fVar10)) &&
             ((((uVar6 = 0xb, 1.0 < fVar10 && (uVar6 = 0xc, 1.0 < fVar10)) &&
               (uVar6 = 0xd, 1.0 < fVar10)) &&
              (((uVar6 = 0xe, 1.0 < fVar10 && (uVar6 = 0xf, 1.0 < fVar10)) &&
               ((uVar6 = 0x10, 1.0 < fVar10 &&
                ((uVar6 = 0x11, 1.0 < fVar10 && (uVar6 = 0x12, 1.0 < fVar10)))))))))) {
            uVar6 = 0x14;
          }
        }
      }
      iVar8 = (int)uVar9;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar8);
      (**(code **)(base + lVar5))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar8);
      uVar4 = (ec->pred).multiclass - 1;
      local_58._begin[uVar4].score = local_58._begin[uVar4].score + 1.0 / (float)uVar2;
      if (bVar3) {
        if (uVar6 < 3) {
          uVar6 = 2;
        }
        iVar7 = uVar6 - 1;
        do {
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar8);
          (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar8);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->bag_size);
  }
  (local_60->scalars).end_array = (float *)local_58.end_array;
  (local_60->scalars).erase_count = local_58.erase_count;
  (local_60->a_s)._begin = local_58._begin;
  (local_60->scalars)._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}